

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

AcceptOnPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AcceptOnPropertyExprSyntax,slang::syntax::AcceptOnPropertyExprSyntax_const&>
          (BumpAllocator *this,AcceptOnPropertyExprSyntax *args)

{
  undefined4 uVar1;
  AcceptOnPropertyExprSyntax *pAVar2;
  long lVar3;
  AcceptOnPropertyExprSyntax *pAVar4;
  byte bVar5;
  
  bVar5 = 0;
  pAVar2 = (AcceptOnPropertyExprSyntax *)allocate(this,0x58,8);
  pAVar4 = pAVar2;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_PropertyExprSyntax).super_SyntaxNode.field_0x4;
    (pAVar4->super_PropertyExprSyntax).super_SyntaxNode.kind =
         (args->super_PropertyExprSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pAVar4->super_PropertyExprSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (AcceptOnPropertyExprSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pAVar4 = (AcceptOnPropertyExprSyntax *)((long)pAVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pAVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }